

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateFinishStructBuffer
          (KotlinGenerator *this,StructDef *struct_def,string *identifier,CodeWriter *writer,
          IDLOptions *options)

{
  undefined8 __s;
  long lVar1;
  anon_class_16_2_22b92921 local_180;
  function<void_()> local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string method_name;
  char *params;
  byte local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  string *identifier_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  id.field_2._8_8_ = options;
  lVar1 = std::__cxx11::string::length();
  local_71 = 0;
  params._2_1_ = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    params._2_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"",(allocator<char> *)((long)&params + 3));
  }
  else {
    std::operator+(&local_70,", \"",identifier);
    local_71 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,"\"");
  }
  if ((params._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 3));
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  method_name.field_2._8_8_ = anon_var_dwarf_147b4c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"finish",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Buffer",&local_f9);
  IdlNamer::LegacyKotlinMethod((string *)local_b0,&this->namer_,&local_d0,struct_def,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  __s = method_name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,(char *)__s,&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
  local_180.id = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  local_180.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinGenerator::GenerateFinishStructBuffer(flatbuffers::StructDef&,std::__cxx11::string_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_170,&local_180);
  GenerateFunOneLine(writer,(string *)local_b0,&local_120,&local_148,&local_170,
                     (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_170);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void GenerateFinishStructBuffer(StructDef &struct_def,
                                  const std::string &identifier,
                                  CodeWriter &writer,
                                  const IDLOptions options) const {
    auto id = identifier.length() > 0 ? ", \"" + identifier + "\"" : "";
    auto params = "builder: FlatBufferBuilder, offset: Int";
    auto method_name =
        namer_.LegacyKotlinMethod("finish", struct_def, "Buffer");
    GenerateFunOneLine(
        writer, method_name, params, "",
        [&]() { writer += "builder.finish(offset" + id + ")"; },
        options.gen_jvmstatic);
  }